

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TestPartResult * __thiscall testing::TestResult::GetTestPartResult(TestResult *this,int i)

{
  const_reference pvVar1;
  
  if ((-1 < i) &&
     (i < (int)(((long)(this->test_part_results_).
                       super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->test_part_results_).
                      super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x70))) {
    pvVar1 = std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::at
                       (&this->test_part_results_,(ulong)(uint)i);
    return pvVar1;
  }
  internal::posix::Abort();
}

Assistant:

const TestPartResult& TestResult::GetTestPartResult(int i) const {
  if (i < 0 || i >= total_part_count())
    internal::posix::Abort();
  return test_part_results_.at(static_cast<size_t>(i));
}